

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  byte bVar1;
  Value VVar2;
  Value *pVVar3;
  Node *value;
  uint uVar4;
  Value VVar5;
  GCObject *pGVar6;
  TValue key;
  Value local_70;
  byte local_68;
  Table newt;
  
  if (0x80000000 < newasize) {
    luaG_runerror(L,"table overflow");
  }
  uVar4 = t->asize;
  pGVar6 = (GCObject *)(ulong)uVar4;
  newt.flags = '\0';
  setnodevector(L,&newt,nhsize);
  VVar5.i._4_4_ = 0;
  VVar5.i._0_4_ = newasize;
  if (newasize < uVar4) {
    exchangehashpart(t,&newt);
    VVar2 = VVar5;
    while (VVar2.gc < pGVar6) {
      bVar1 = *(byte *)((long)t->array + (long)((long)&(VVar2.gc)->next + 4));
      if ((bVar1 & 0xf) == 0) {
        VVar2.gc = (GCObject *)((long)&(VVar2.gc)->next + 1);
      }
      else {
        key.tt_ = '\x03';
        local_70 = t->array[-1 - (long)VVar2];
        key.value_.gc = (GCObject *)(VVar2.i + 1U);
        local_68 = bVar1;
        insertkey(t,&key,(TValue *)&local_70);
        VVar2.gc = (GCObject *)(VVar2.i + 1U);
      }
    }
    exchangehashpart(t,&newt);
  }
  pVVar3 = resizearray(L,t,uVar4,newasize);
  if ((newasize != 0) && (pVVar3 == (Value *)0x0)) {
    freehash(L,&newt);
    luaD_throw(L,'\x04');
  }
  exchangehashpart(t,&newt);
  t->array = pVVar3;
  t->asize = newasize;
  if (pVVar3 != (Value *)0x0) {
    *(uint *)pVVar3 = newasize >> 1;
  }
  for (; pGVar6 < VVar5.gc; pGVar6 = (GCObject *)((long)&pGVar6->next + 1)) {
    *(undefined1 *)((long)t->array + (long)((long)&pGVar6->next + 4)) = 0x10;
  }
  for (uVar4 = 0; uVar4 >> (newt.lsizenode & 0x1f) == 0; uVar4 = uVar4 + 1) {
    if ((*(byte *)((long)newt.node + (ulong)uVar4 * 0x18 + 8) & 0xf) != 0) {
      value = newt.node + uVar4;
      key.value_ = (value->u).key_val;
      key.tt_ = (value->u).key_tt;
      newcheckedkey(t,&key,&value->i_val);
    }
  }
  freehash(L,&newt);
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned newasize,
                                          unsigned nhsize) {
  Table newt;  /* to keep the new hash part */
  unsigned oldasize = t->asize;
  Value *newarray;
  if (newasize > MAXASIZE)
    luaG_runerror(L, "table overflow");
  /* create new hash part with appropriate size into 'newt' */
  newt.flags = 0;
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    /* re-insert into the new hash the elements from vanishing slice */
    exchangehashpart(t, &newt);  /* pretend table has new hash */
    reinsertOldSlice(t, oldasize, newasize);
    exchangehashpart(t, &newt);  /* restore old hash (in case of errors) */
  }
  /* allocate new array */
  newarray = resizearray(L, t, oldasize, newasize);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->asize = newasize;
  if (newarray != NULL)
    *lenhint(t) = newasize / 2u;  /* set an initial hint */
  clearNewSlice(t, oldasize, newasize);
  /* re-insert elements from old hash part into new parts */
  reinserthash(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}